

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O3

void __thiscall google::protobuf::json_internal::Mark::Discard(Mark *this)

{
  BufferingGuard local_10;
  
  local_10.owner_ = (ZeroCopyBufferedStream *)0x0;
  BufferingGuard::operator=(&this->guard_,&local_10);
  if (local_10.owner_ != (ZeroCopyBufferedStream *)0x0) {
    ZeroCopyBufferedStream::DownRefBuffer(local_10.owner_);
  }
  return;
}

Assistant:

void Discard() && { guard_ = BufferingGuard(); }